

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

void __thiscall
vkt::synchronization::anon_unknown_0::Draw::Implementation::~Implementation(Implementation *this)

{
  VkPipeline obj;
  VkPipelineLayout obj_00;
  VkFramebuffer obj_01;
  VkRenderPass obj_02;
  VkImageView obj_03;
  pointer puVar1;
  pointer pVVar2;
  
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Implementation_00d02300;
  obj.m_internal =
       (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,obj
              );
  }
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  obj_00.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_00);
  }
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_01.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_01);
  }
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  obj_02.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj_02);
  }
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  obj_03.m_internal =
       (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (obj_03.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj_03);
  }
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            (&(this->m_indirectBuffer).
              super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            );
  puVar1 = (this->m_expectedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_expectedData).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            (&(this->m_vertices).m_indexBuffer.
              super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            );
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            (&(this->m_vertices).m_vertexBuffer.
              super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            );
  pVVar2 = (this->m_vertices).m_vertexData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)(this->m_vertices).m_vertexData.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2);
    return;
  }
  return;
}

Assistant:

Implementation (OperationContext& context, Resource& resource, const DrawCall drawCall)
		: m_context		(context)
		, m_resource	(resource)
		, m_drawCall	(drawCall)
		, m_vertices	(context)
	{
		const DeviceInterface&		vk				= context.getDeviceInterface();
		const VkDevice				device			= context.getDevice();
		Allocator&					allocator		= context.getAllocator();

		// Indirect buffer

		if (m_drawCall == DRAW_CALL_DRAW_INDIRECT)
		{
			m_indirectBuffer = de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
				makeBufferCreateInfo(sizeof(VkDrawIndirectCommand), VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT), MemoryRequirement::HostVisible));

			const Allocation&				alloc				= m_indirectBuffer->getAllocation();
			VkDrawIndirectCommand* const	pIndirectCommand	= static_cast<VkDrawIndirectCommand*>(alloc.getHostPtr());

			pIndirectCommand->vertexCount	= m_vertices.getNumVertices();
			pIndirectCommand->instanceCount	= 1u;
			pIndirectCommand->firstVertex	= 0u;
			pIndirectCommand->firstInstance	= 0u;

			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(VkDrawIndirectCommand));
		}
		else if (m_drawCall == DRAW_CALL_DRAW_INDEXED_INDIRECT)
		{
			m_indirectBuffer = de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
				makeBufferCreateInfo(sizeof(VkDrawIndexedIndirectCommand), VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT), MemoryRequirement::HostVisible));

			const Allocation&					alloc				= m_indirectBuffer->getAllocation();
			VkDrawIndexedIndirectCommand* const	pIndirectCommand	= static_cast<VkDrawIndexedIndirectCommand*>(alloc.getHostPtr());

			pIndirectCommand->indexCount	= m_vertices.getNumIndices();
			pIndirectCommand->instanceCount	= 1u;
			pIndirectCommand->firstIndex	= 0u;
			pIndirectCommand->vertexOffset	= 0u;
			pIndirectCommand->firstInstance	= 0u;

			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(VkDrawIndexedIndirectCommand));
		}

		// Resource image is the color attachment

		m_colorFormat			= m_resource.getImage().format;
		m_colorSubresourceRange	= m_resource.getImage().subresourceRange;
		m_colorImage			= m_resource.getImage().handle;
		m_attachmentExtent		= m_resource.getImage().extent;

		// Pipeline

		m_colorAttachmentView	= makeImageView						  (vk, device, m_colorImage, VK_IMAGE_VIEW_TYPE_2D, m_colorFormat, m_colorSubresourceRange);
		m_renderPass			= makeRenderPass					  (vk, device, m_colorFormat);
		m_framebuffer			= makeFramebuffer					  (vk, device, *m_renderPass, *m_colorAttachmentView, m_attachmentExtent.width, m_attachmentExtent.height, 1u);
		m_pipelineLayout		= makePipelineLayoutWithoutDescriptors(vk, device);

		GraphicsPipelineBuilder pipelineBuilder;
		pipelineBuilder
			.setRenderSize					(tcu::IVec2(m_attachmentExtent.width, m_attachmentExtent.height))
			.setVertexInputSingleAttribute	(m_vertices.getVertexFormat(), m_vertices.getVertexStride())
			.setShader						(vk, device, VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("draw_vert"), DE_NULL)
			.setShader						(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("draw_frag"), DE_NULL);

		m_pipeline = pipelineBuilder.build(vk, device, *m_pipelineLayout, *m_renderPass, context.getPipelineCacheData());

		// Set expected draw values

		m_expectedData.resize(static_cast<size_t>(getPixelBufferSize(m_resource.getImage().format, m_resource.getImage().extent)));
		tcu::PixelBufferAccess imagePixels(mapVkFormat(m_colorFormat), m_attachmentExtent.width, m_attachmentExtent.height, m_attachmentExtent.depth, &m_expectedData[0]);
		clearPixelBuffer(imagePixels, makeClearValue(m_colorFormat));
	}